

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O1

RationalNum * __thiscall RationalNum::operator--(RationalNum *this)

{
  RationalNum RVar1;
  RationalNum temp;
  RationalNum local_40;
  RationalNum local_30;
  
  local_30.numerator = 1;
  local_30.denominator = 1;
  simplify(&local_30);
  local_40.denominator = 1;
  local_40.numerator = (longlong)-(int)local_30.numerator;
  setDenominator(&local_40,(long)(int)local_30.denominator);
  RVar1 = ::operator+(this,&local_40);
  this->numerator = (long)(int)RVar1.numerator;
  setDenominator(this,(long)(int)RVar1.denominator);
  return this;
}

Assistant:

RationalNum &RationalNum::operator--() {
    *this = *this - 1ll;
    return *this;
}